

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-time.c
# Opt level: O1

int string_to_parts(char *format,char *str,int *year,int *month,int *day,int *hour,int *minute,
                   int *second,int *musec)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  char cVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  int iVar9;
  char *pcVar10;
  long lVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  int day_of_year;
  int local_34;
  
  *year = 2000;
  *month = 1;
  *day = 1;
  iVar12 = 0;
  *hour = 0;
  *minute = 0;
  *second = 0;
  *musec = 0;
  cVar5 = *format;
  bVar2 = false;
  if (cVar5 != '\0') {
    bVar2 = false;
    iVar12 = 0;
    uVar14 = 0;
    do {
      uVar14 = (ulong)(int)uVar14;
      while( true ) {
        if ((!bVar2) && (cVar5 == '|')) goto LAB_001611f1;
        if (cVar5 != '\'') goto LAB_00160c8a;
        if (format[uVar14 + 1] == '\'') break;
        bVar2 = (bool)(bVar2 ^ 1);
        cVar5 = format[uVar14 + 1];
        uVar14 = uVar14 + 1;
        if (cVar5 == '\0') goto LAB_001611f1;
      }
      uVar14 = (ulong)((int)uVar14 + 1);
LAB_00160c8a:
      iVar9 = (int)uVar14;
      lVar11 = (long)iVar9;
      bVar1 = format[lVar11];
      if (bVar2) {
LAB_00160c96:
        if (bVar1 != str[iVar12]) {
          pcVar10 = "date/time argument (%s) has an incorrect fixed character (format: %s)";
          goto LAB_00161226;
        }
        uVar14 = (ulong)(iVar9 + 1);
        iVar12 = iVar12 + 1;
      }
      else if (bVar1 < 100) {
        if (bVar1 < 0x4d) {
          if (bVar1 == 0x44) {
            if ((format[lVar11 + 1] != 'D') || (format[lVar11 + 2] != 'D')) goto LAB_00160f51;
            iVar6 = parse_integer(str + iVar12,3,(uint)(format[lVar11 + 3] == '*'),&local_34);
            if (iVar6 == 0) {
              iVar6 = coda_dayofyear_to_month_day(*year,local_34,month,day);
              if (iVar6 != 0) {
                pcVar10 = "date/time argument (%s) has an invalid day value (format: %s)";
                goto LAB_00161199;
              }
              uVar14 = (ulong)(iVar9 + (uint)(format[lVar11 + 3] == '*') + 3);
              iVar12 = iVar12 + 3;
              bVar3 = true;
            }
            else {
              pcVar10 = "date/time argument (%s) has an incorrect day value (format: %s)";
LAB_00161199:
              bVar3 = false;
              coda_set_error(-0x68,pcVar10,str,format);
            }
            if (!bVar3) {
              return -1;
            }
            goto LAB_00161118;
          }
          if (bVar1 != 0x48) goto LAB_00161146;
LAB_00160cce:
          if (format[lVar11 + 1] == 'H') {
            iVar6 = parse_integer(str + iVar12,2,(uint)(format[lVar11 + 2] == '*'),hour);
            if (iVar6 == 0) goto LAB_001610df;
            pcVar10 = "date/time argument (%s) has an incorrect hour value (format: %s)";
            goto LAB_00161226;
          }
          if (bVar1 != 0x53) {
            if (bVar1 != 0x73) goto LAB_00160e92;
            goto LAB_00160fbe;
          }
        }
        else {
          if (bVar1 == 0x4d) {
            if (format[lVar11 + 1] == 'M') {
              if (format[lVar11 + 2] == 'M') {
                iVar6 = coda_month_to_integer(str + iVar12);
                *month = iVar6;
                if (iVar6 != -1) {
                  uVar13 = iVar9 + 3;
                  iVar12 = iVar12 + 3;
                  goto LAB_001610fa;
                }
                pcVar10 = "date/time argument (%s) has an incorrect month value (format: %s)";
              }
              else {
                iVar6 = parse_integer(str + iVar12,2,(uint)(format[lVar11 + 2] == '*'),month);
                if (iVar6 == 0) goto LAB_001610df;
                pcVar10 = "date/time argument (%s) has an incorrect month value (format: %s)";
              }
              goto LAB_00161226;
            }
LAB_00160f51:
            if (bVar1 == 0x48) goto LAB_00160cce;
          }
LAB_0016100a:
          if (bVar1 != 0x53) {
LAB_00161146:
            if (((0x19 < (byte)(bVar1 + 0xbf)) && (bVar1 != 0x2a)) && (0x19 < (byte)(bVar1 + 0x9f)))
            goto LAB_00160c96;
            pcVar10 = "unsuppored character sequence in date/time format (%s)";
            goto LAB_001611fc;
          }
        }
LAB_00161013:
        lVar7 = 0;
        if (format[lVar11] == 'S') {
          lVar7 = 0;
          do {
            lVar4 = lVar7 + lVar11 + 1;
            lVar7 = lVar7 + 1;
          } while (format[lVar4] == 'S');
          uVar14 = (ulong)(uint)(iVar9 + (int)lVar7);
        }
        *musec = 0;
        uVar13 = (uint)lVar7;
        if (uVar13 != 0) {
          uVar8 = 6;
          if (uVar13 < 6) {
            uVar8 = uVar13;
          }
          pcVar10 = str + iVar12;
          iVar9 = uVar8 + 1;
          do {
            if ((byte)(*pcVar10 - 0x3aU) < 0xf6) {
              pcVar10 = 
              "date/time argument (%s) has an incorrect fractional second value (format: %s)";
              goto LAB_00161226;
            }
            *musec = (uint)(byte)(*pcVar10 - 0x30) + *musec * 10;
            pcVar10 = pcVar10 + 1;
            iVar9 = iVar9 + -1;
          } while (1 < iVar9);
        }
        iVar12 = iVar12 + uVar13;
        if (uVar13 < 6) {
          iVar9 = *musec;
          iVar6 = uVar13 - 6;
          do {
            iVar9 = iVar9 * 10;
            iVar6 = iVar6 + 1;
          } while (iVar6 != 0);
          *musec = iVar9;
        }
      }
      else {
        if (bVar1 < 0x73) {
          if (bVar1 == 100) {
            if (format[lVar11 + 1] != 'd') {
LAB_00160f5f:
              if (bVar1 == 0x6d) goto LAB_00160f64;
              goto LAB_00160fb5;
            }
            iVar6 = parse_integer(str + iVar12,2,(uint)(format[lVar11 + 2] == '*'),day);
            if (iVar6 != 0) {
              pcVar10 = "date/time argument (%s) has an incorrect day value (format: %s)";
              goto LAB_00161226;
            }
          }
          else {
LAB_00160e92:
            if (bVar1 != 0x6d) goto LAB_00161146;
LAB_00160f64:
            if (format[lVar11 + 1] != 'm') {
              if (bVar1 == 0x53) goto LAB_00161013;
LAB_00160fb5:
              if (bVar1 != 0x73) goto LAB_00161146;
              goto LAB_00160fbe;
            }
            iVar6 = parse_integer(str + iVar12,2,(uint)(format[lVar11 + 2] == '*'),minute);
            if (iVar6 != 0) {
              pcVar10 = "date/time argument (%s) has an incorrect minute value (format: %s)";
              goto LAB_00161226;
            }
          }
LAB_001610df:
          uVar13 = iVar9 + (uint)(format[lVar11 + 2] == '*') + 2;
          iVar12 = iVar12 + 2;
        }
        else {
          if (bVar1 == 0x73) {
LAB_00160fbe:
            if (format[lVar11 + 1] != 's') goto LAB_0016100a;
            iVar6 = parse_integer(str + iVar12,2,(uint)(format[lVar11 + 2] == '*'),second);
            if (iVar6 == 0) goto LAB_001610df;
            pcVar10 = "date/time argument (%s) has an incorrect second value (format: %s)";
            goto LAB_00161226;
          }
          if (bVar1 != 0x79) goto LAB_00161146;
          if (((format[lVar11 + 1] != 'y') || (format[lVar11 + 2] != 'y')) ||
             (format[lVar11 + 3] != 'y')) goto LAB_00160f5f;
          iVar6 = parse_integer(str + iVar12,4,(uint)(format[lVar11 + 4] == '*'),year);
          if (iVar6 != 0) {
            pcVar10 = "date/time argument (%s) has an incorrect year value (format: %s)";
            goto LAB_00161226;
          }
          uVar13 = iVar9 + (uint)(format[lVar11] == '*') + 4;
          iVar12 = iVar12 + 4;
        }
LAB_001610fa:
        uVar14 = (ulong)uVar13;
      }
LAB_00161118:
      cVar5 = format[(int)uVar14];
    } while (cVar5 != '\0');
  }
LAB_001611f1:
  if (bVar2) {
    pcVar10 = "missing closing \' in date/time format (%s)";
LAB_001611fc:
    coda_set_error(-0x67,pcVar10,format);
  }
  else {
    if (str[iVar12] == '\0') {
      return 0;
    }
    pcVar10 = "date/time argument (%s) contains additional characters (format: %s)";
LAB_00161226:
    coda_set_error(-0x68,pcVar10,str,format);
  }
  return -1;
}

Assistant:

static int string_to_parts(const char *format, const char *str, int *year, int *month, int *day, int *hour,
                           int *minute, int *second, int *musec)
{
    int use_leading_spaces;
    int format_index = 0;
    int string_index = 0;
    int literal = 0;
    int n;

    /* initialize with epoch 2000-01-01T00:00:00.000000 */
    *year = 2000;
    *month = 1;
    *day = 1;
    *hour = 0;
    *minute = 0;
    *second = 0;
    *musec = 0;

    while (format[format_index] != '\0' && (literal || format[format_index] != '|'))
    {
        if (format[format_index] == '\'')
        {
            format_index++;
            if (format[format_index] != '\'')
            {
                literal = !literal;
                continue;
            }
        }
        if (literal)
        {
            /* literal match */
            if (format[format_index] != str[string_index])
            {
                coda_set_error(CODA_ERROR_INVALID_DATETIME, "date/time argument (%s) has an incorrect fixed character "
                               "(format: %s)", str, format);
                return -1;
            }
            format_index++;
            string_index++;
        }
        else if (format[format_index] == 'y' && format[format_index + 1] == 'y' && format[format_index + 2] == 'y' &&
                 format[format_index + 3] == 'y')
        {
            use_leading_spaces = format[format_index + 4] == '*';
            if (parse_integer(&str[string_index], 4, use_leading_spaces, year) != 0)
            {
                coda_set_error(CODA_ERROR_INVALID_DATETIME, "date/time argument (%s) has an incorrect year value "
                               "(format: %s)", str, format);
                return -1;
            }
            format_index += 4 + (format[format_index] == '*');
            string_index += 4;
        }
        else if (format[format_index] == 'M' && format[format_index + 1] == 'M')
        {
            if (format[format_index + 2] == 'M')
            {
                /* coda_month_to_integer already limits comparison to only 3 characters */
                *month = coda_month_to_integer(&str[string_index]);
                if (*month == -1)
                {
                    coda_set_error(CODA_ERROR_INVALID_DATETIME, "date/time argument (%s) has an incorrect month value "
                                   "(format: %s)", str, format);
                    return -1;
                }
                format_index += 3;
                string_index += 3;
            }
            else
            {
                use_leading_spaces = format[format_index + 2] == '*';
                if (parse_integer(&str[string_index], 2, use_leading_spaces, month) != 0)
                {
                    coda_set_error(CODA_ERROR_INVALID_DATETIME, "date/time argument (%s) has an incorrect month value "
                                   "(format: %s)", str, format);
                    return -1;
                }
                format_index += 2 + (format[format_index + 2] == '*');
                string_index += 2;
            }
        }
        else if (format[format_index] == 'd' && format[format_index + 1] == 'd')
        {
            use_leading_spaces = format[format_index + 2] == '*';
            if (parse_integer(&str[string_index], 2, use_leading_spaces, day) != 0)
            {
                coda_set_error(CODA_ERROR_INVALID_DATETIME, "date/time argument (%s) has an incorrect day value "
                               "(format: %s)", str, format);
                return -1;
            }
            format_index += 2 + (format[format_index + 2] == '*');
            string_index += 2;
        }
        else if (format[format_index] == 'D' && format[format_index + 1] == 'D' && format[format_index + 2] == 'D')
        {
            int day_of_year;

            use_leading_spaces = format[format_index + 3] == '*';
            /* uses currently parsed year value to determine the actual month/day within the year */
            if (parse_integer(&str[string_index], 3, use_leading_spaces, &day_of_year) != 0)
            {
                coda_set_error(CODA_ERROR_INVALID_DATETIME, "date/time argument (%s) has an incorrect day value "
                               "(format: %s)", str, format);
                return -1;
            }
            if (coda_dayofyear_to_month_day(*year, day_of_year, month, day) != 0)
            {
                coda_set_error(CODA_ERROR_INVALID_DATETIME, "date/time argument (%s) has an invalid day value "
                               "(format: %s)", str, format);
                return -1;
            }
            format_index += 3 + (format[format_index + 3] == '*');
            string_index += 3;
        }
        else if (format[format_index] == 'H' && format[format_index + 1] == 'H')
        {
            use_leading_spaces = format[format_index + 2] == '*';
            if (parse_integer(&str[string_index], 2, use_leading_spaces, hour) != 0)
            {
                coda_set_error(CODA_ERROR_INVALID_DATETIME, "date/time argument (%s) has an incorrect hour value "
                               "(format: %s)", str, format);
                return -1;
            }
            format_index += 2 + (format[format_index + 2] == '*');
            string_index += 2;
        }
        else if (format[format_index] == 'm' && format[format_index + 1] == 'm')
        {
            use_leading_spaces = format[format_index + 2] == '*';
            if (parse_integer(&str[string_index], 2, use_leading_spaces, minute) != 0)
            {
                coda_set_error(CODA_ERROR_INVALID_DATETIME, "date/time argument (%s) has an incorrect minute value "
                               "(format: %s)", str, format);
                return -1;
            }
            format_index += 2 + (format[format_index + 2] == '*');
            string_index += 2;
        }
        else if (format[format_index] == 's' && format[format_index + 1] == 's')
        {
            use_leading_spaces = format[format_index + 2] == '*';
            if (parse_integer(&str[string_index], 2, use_leading_spaces, second) != 0)
            {
                coda_set_error(CODA_ERROR_INVALID_DATETIME, "date/time argument (%s) has an incorrect second value "
                               "(format: %s)", str, format);
                return -1;
            }
            format_index += 2 + (format[format_index + 2] == '*');
            string_index += 2;
        }
        else if (format[format_index] == 'S')
        {
            n = 0;
            while (format[format_index] == 'S')
            {
                format_index++;
                n++;
            }
            if (parse_integer(&str[string_index], n > 6 ? 6 : n, 0, musec) != 0)
            {
                coda_set_error(CODA_ERROR_INVALID_DATETIME, "date/time argument (%s) has an incorrect fractional "
                               "second value (format: %s)", str, format);
                return -1;
            }
            string_index += n;
            while (n < 6)
            {
                *musec *= 10;
                n++;
            }
        }
        else if ((format[format_index] >= 'A' && format[format_index] <= 'Z') ||
                 (format[format_index] >= 'a' && format[format_index] <= 'z') || format[format_index] == '*')
        {
            /* reserved character */
            coda_set_error(CODA_ERROR_INVALID_FORMAT, "unsuppored character sequence in date/time format (%s)", format);
            return -1;
        }
        else
        {
            /* literal match */
            if (format[format_index] != str[string_index])
            {
                coda_set_error(CODA_ERROR_INVALID_DATETIME, "date/time argument (%s) has an incorrect fixed character "
                               "(format: %s)", str, format);
                return -1;
            }
            format_index++;
            string_index++;
        }
    }
    if (literal)
    {
        coda_set_error(CODA_ERROR_INVALID_FORMAT, "missing closing ' in date/time format (%s)", format);
        return -1;
    }
    if (str[string_index] != '\0')
    {
        coda_set_error(CODA_ERROR_INVALID_DATETIME, "date/time argument (%s) contains additional characters "
                       "(format: %s)", str, format);
        return -1;
    }

    return 0;
}